

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# updatevector.h
# Opt level: O3

void __thiscall
soplex::
UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTolerances(UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,shared_ptr<soplex::Tolerances> *tolerances)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  peVar1 = (tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_8._M_pi =
       (tolerances->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
    }
  }
  (this->thedelta)._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->thedelta)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_8);
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8._M_pi);
  }
  return;
}

Assistant:

void setTolerances(std::shared_ptr<Tolerances>& tolerances)
   {
      thedelta.setTolerances(tolerances);
   }